

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

uint estimate_scroll_motion
               (AV1_COMP *cpi,uint8_t *src_buf,uint8_t *last_src_buf,int src_stride,int ref_stride,
               BLOCK_SIZE bsize,int pos_col,int pos_row,int *best_intmv_col,int *best_intmv_row,
               int sw_col,int sw_row)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int16_t *piVar8;
  int16_t *piVar9;
  int *sad;
  int16_t *piVar10;
  int in_ECX;
  long in_RDX;
  uint8_t *in_RSI;
  long in_RDI;
  int in_R8D;
  byte in_R9B;
  int in_stack_00000008;
  int best_sad_row;
  int best_sad_col;
  uint best_sad;
  int16_t *src_vbuf;
  int16_t *src_hbuf;
  int16_t *vbuf;
  int16_t *hbuf;
  int ref_buf_height;
  int ref_buf_width;
  int col_norm_factor;
  int row_norm_factor;
  uint8_t *ref_buf;
  int search_size_height;
  int search_size_width;
  int border;
  int full_search;
  int bh;
  int bw;
  AV1_COMMON *cm;
  undefined4 in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff74;
  uint local_88;
  uint local_84;
  int full_search_00;
  int local_48;
  int local_44;
  
  uVar1 = (uint)block_size_wide[in_R9B];
  uVar2 = (uint)block_size_high[in_R9B];
  iVar3 = *(int *)(in_RDI + 0x42724) >> 4;
  iVar4 = iVar3 * 0x10;
  local_44 = (int)vbuf;
  local_48 = (int)hbuf;
  if ((SBORROW4(in_stack_00000008 - (int)vbuf,iVar3 * -0x10) !=
       (in_stack_00000008 - (int)vbuf) + iVar4 < 0) ||
     (*(int *)(in_RDI + 0x3bfb8) + iVar4 < in_stack_00000008 + (int)vbuf)) {
    local_44 = iVar4;
  }
  if ((SBORROW4(best_sad_col - (int)hbuf,iVar3 * -0x10) != (best_sad_col - (int)hbuf) + iVar4 < 0)
     || (*(int *)(in_RDI + 0x3bfbc) + iVar4 < best_sad_col + (int)hbuf)) {
    local_48 = iVar4;
  }
  iVar3 = ""[in_R9B] + 1;
  iVar4 = ((int)uVar1 >> 5) + 3;
  iVar5 = local_44 * 2 + uVar1;
  iVar6 = local_48 * 2 + uVar2;
  piVar8 = (int16_t *)aom_malloc(0x2cfcd4);
  piVar9 = (int16_t *)aom_malloc(0x2cfce6);
  sad = (int *)aom_malloc(0x2cfcf8);
  piVar10 = (int16_t *)aom_malloc(0x2cfd0a);
  if ((((piVar8 == (int16_t *)0x0) || (piVar9 == (int16_t *)0x0)) || (sad == (int *)0x0)) ||
     (piVar10 == (int16_t *)0x0)) {
    aom_free((void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    aom_free((void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    aom_free((void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    aom_free((void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x3bfb0),AOM_CODEC_MEM_ERROR,
                       "Failed to allocate hbuf, vbuf, src_hbuf, or src_vbuf");
  }
  (*aom_int_pro_row)(piVar8,(uint8_t *)(in_RDX - local_44),in_R8D,iVar5,uVar2,iVar3);
  (*aom_int_pro_col)(piVar9,(uint8_t *)(in_RDX - local_48 * in_R8D),in_R8D,uVar1,iVar6,iVar4);
  full_search_00 = (int)((ulong)piVar9 >> 0x20);
  (*aom_int_pro_row)((int16_t *)sad,in_RSI,in_ECX,uVar1,uVar2,iVar3);
  (*aom_int_pro_col)(piVar10,in_RSI,in_ECX,uVar1,uVar2,iVar4);
  iVar7 = av1_vector_match((int16_t *)CONCAT44(iVar3,iVar4),(int16_t *)CONCAT44(iVar5,iVar6),
                           (int)((ulong)piVar8 >> 0x20),(int)piVar8,full_search_00,sad);
  *(int *)src_vbuf = iVar7;
  iVar3 = av1_vector_match((int16_t *)CONCAT44(iVar3,iVar4),(int16_t *)CONCAT44(iVar5,iVar6),
                           (int)((ulong)piVar8 >> 0x20),(int)piVar8,full_search_00,sad);
  *(int *)src_hbuf = iVar3;
  if ((int)local_88 < (int)in_stack_ffffffffffffff74) {
    src_hbuf[0] = 0;
    src_hbuf[1] = 0;
    local_84 = local_88;
  }
  else {
    src_vbuf[0] = 0;
    src_vbuf[1] = 0;
    local_84 = in_stack_ffffffffffffff74;
  }
  aom_free((void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  aom_free((void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  aom_free((void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  aom_free((void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  return local_84;
}

Assistant:

static unsigned int estimate_scroll_motion(
    const AV1_COMP *cpi, uint8_t *src_buf, uint8_t *last_src_buf,
    int src_stride, int ref_stride, BLOCK_SIZE bsize, int pos_col, int pos_row,
    int *best_intmv_col, int *best_intmv_row, int sw_col, int sw_row) {
  const AV1_COMMON *const cm = &cpi->common;
  const int bw = block_size_wide[bsize];
  const int bh = block_size_high[bsize];
  const int full_search = 1;
  // Keep border a multiple of 16.
  const int border = (cpi->oxcf.border_in_pixels >> 4) << 4;
  int search_size_width = sw_col;
  int search_size_height = sw_row;
  // Adjust based on boundary.
  if ((pos_col - search_size_width < -border) ||
      (pos_col + search_size_width > cm->width + border))
    search_size_width = border;
  if ((pos_row - search_size_height < -border) ||
      (pos_row + search_size_height > cm->height + border))
    search_size_height = border;
  const uint8_t *ref_buf;
  const int row_norm_factor = mi_size_high_log2[bsize] + 1;
  const int col_norm_factor = 3 + (bw >> 5);
  const int ref_buf_width = (search_size_width << 1) + bw;
  const int ref_buf_height = (search_size_height << 1) + bh;
  int16_t *hbuf = (int16_t *)aom_malloc(ref_buf_width * sizeof(*hbuf));
  int16_t *vbuf = (int16_t *)aom_malloc(ref_buf_height * sizeof(*vbuf));
  int16_t *src_hbuf = (int16_t *)aom_malloc(bw * sizeof(*src_hbuf));
  int16_t *src_vbuf = (int16_t *)aom_malloc(bh * sizeof(*src_vbuf));
  if (!hbuf || !vbuf || !src_hbuf || !src_vbuf) {
    aom_free(hbuf);
    aom_free(vbuf);
    aom_free(src_hbuf);
    aom_free(src_vbuf);
    aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                       "Failed to allocate hbuf, vbuf, src_hbuf, or src_vbuf");
  }
  // Set up prediction 1-D reference set for rows.
  ref_buf = last_src_buf - search_size_width;
  aom_int_pro_row(hbuf, ref_buf, ref_stride, ref_buf_width, bh,
                  row_norm_factor);
  // Set up prediction 1-D reference set for cols
  ref_buf = last_src_buf - search_size_height * ref_stride;
  aom_int_pro_col(vbuf, ref_buf, ref_stride, bw, ref_buf_height,
                  col_norm_factor);
  // Set up src 1-D reference set
  aom_int_pro_row(src_hbuf, src_buf, src_stride, bw, bh, row_norm_factor);
  aom_int_pro_col(src_vbuf, src_buf, src_stride, bw, bh, col_norm_factor);
  unsigned int best_sad;
  int best_sad_col, best_sad_row;
  // Find the best match per 1-D search
  *best_intmv_col =
      av1_vector_match(hbuf, src_hbuf, mi_size_wide_log2[bsize],
                       search_size_width, full_search, &best_sad_col);
  *best_intmv_row =
      av1_vector_match(vbuf, src_vbuf, mi_size_high_log2[bsize],
                       search_size_height, full_search, &best_sad_row);
  if (best_sad_col < best_sad_row) {
    *best_intmv_row = 0;
    best_sad = best_sad_col;
  } else {
    *best_intmv_col = 0;
    best_sad = best_sad_row;
  }
  aom_free(hbuf);
  aom_free(vbuf);
  aom_free(src_hbuf);
  aom_free(src_vbuf);
  return best_sad;
}